

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

double Highs_getHighsRunTime(void *highs)

{
  double dVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Highs_getHighsRunTime",&local_49);
  std::__cxx11::string::string((string *)&local_48,"Highs_getRunTime",&local_4a);
  Highs::deprecationMessage((Highs *)highs,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  dVar1 = Highs::getRunTime((Highs *)highs);
  return dVar1;
}

Assistant:

double Highs_getHighsRunTime(const void* highs) {
  ((Highs*)highs)
      ->deprecationMessage("Highs_getHighsRunTime", "Highs_getRunTime");
  return Highs_getRunTime(highs);
}